

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_2cfb1b::SwiftCompilerShellCommand::configureAttribute
          (SwiftCompilerShellCommand *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  StringRef value_00;
  type tVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  bool *to;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  string *this_00;
  char *pcVar6;
  ConfigureContext *ctx_00;
  StringRef name_00;
  StringRef Separator;
  StringRef Separator_00;
  StringRef Separator_01;
  StringRef Separator_02;
  StringRef value_local;
  int numThreadsInt;
  Child local_288;
  size_t sStack_280;
  undefined8 local_278;
  StringRef name_local;
  Twine local_258;
  SmallVector<llvm::StringRef,_32U> objects;
  
  value_local.Length = value.Length;
  pcVar6 = value.Data;
  name_local.Length = name.Length;
  to = (bool *)name.Data;
  value_local.Data = pcVar6;
  name_local.Data = to;
  switch(name_local.Length) {
  case 7:
    iVar3 = bcmp(to,"sources",7);
    if (iVar3 == 0) {
      objects.super_SmallVectorImpl<llvm::StringRef>.
      super_SmallVectorTemplateBase<llvm::StringRef,_true>.
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX =
           &objects.super_SmallVectorStorage<llvm::StringRef,_32U>;
      objects.super_SmallVectorImpl<llvm::StringRef>.
      super_SmallVectorTemplateBase<llvm::StringRef,_true>.
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
      objects.super_SmallVectorImpl<llvm::StringRef>.
      super_SmallVectorTemplateBase<llvm::StringRef,_true>.
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity = 0x20;
      local_288.cString = value_local.Data;
      sStack_280 = value_local.Length;
      Separator_01.Length = 1;
      Separator_01.Data = " ";
      llvm::StringRef::split
                ((StringRef *)&local_288,&objects.super_SmallVectorImpl<llvm::StringRef>,
                 Separator_01,-1,false);
      local_288.twine = (Twine *)0x0;
      sStack_280 = 0;
      local_278 = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<llvm::StringRef*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_288,
                 objects.super_SmallVectorImpl<llvm::StringRef>.
                 super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                 super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX
                 ,(void *)((objects.super_SmallVectorImpl<llvm::StringRef>.
                            super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                            super_SmallVectorBase._8_8_ & 0xffffffff) * 0x10 +
                          (long)objects.super_SmallVectorImpl<llvm::StringRef>.
                                super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                super_SmallVectorBase.BeginX));
      pvVar5 = &this->sourcesList;
    }
    else {
      iVar3 = bcmp(to,"objects",7);
      if (iVar3 != 0) break;
      objects.super_SmallVectorImpl<llvm::StringRef>.
      super_SmallVectorTemplateBase<llvm::StringRef,_true>.
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX =
           &objects.super_SmallVectorStorage<llvm::StringRef,_32U>;
      objects.super_SmallVectorImpl<llvm::StringRef>.
      super_SmallVectorTemplateBase<llvm::StringRef,_true>.
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
      objects.super_SmallVectorImpl<llvm::StringRef>.
      super_SmallVectorTemplateBase<llvm::StringRef,_true>.
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity = 0x20;
      local_288.cString = value_local.Data;
      sStack_280 = value_local.Length;
      Separator.Length = 1;
      Separator.Data = " ";
      llvm::StringRef::split
                ((StringRef *)&local_288,&objects.super_SmallVectorImpl<llvm::StringRef>,Separator,
                 -1,false);
      local_288.twine = (Twine *)0x0;
      sStack_280 = 0;
      local_278 = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<llvm::StringRef*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_288,
                 objects.super_SmallVectorImpl<llvm::StringRef>.
                 super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                 super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX
                 ,(void *)((objects.super_SmallVectorImpl<llvm::StringRef>.
                            super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                            super_SmallVectorBase._8_8_ & 0xffffffff) * 0x10 +
                          (long)objects.super_SmallVectorImpl<llvm::StringRef>.
                                super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                super_SmallVectorBase.BeginX));
      pvVar5 = &this->objectsList;
    }
    goto LAB_0017e11b;
  case 8:
  case 9:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
    break;
  case 10:
    iVar3 = bcmp(to,"executable",10);
    if (iVar3 == 0) {
      llvm::StringRef::str_abi_cxx11_((string *)&objects,&value_local);
      this_00 = (string *)&this->executable;
    }
    else {
      iVar3 = bcmp(to,"temps-path",10);
      if (iVar3 != 0) {
        iVar3 = bcmp(to,"is-library",10);
        if (iVar3 == 0) {
          ctx_00 = (ConfigureContext *)&this->isLibrary;
          pcVar4 = (char *)0xa;
          goto LAB_0017e16f;
        }
        iVar3 = bcmp(to,"other-args",10);
        if (iVar3 == 0) {
          objects.super_SmallVectorImpl<llvm::StringRef>.
          super_SmallVectorTemplateBase<llvm::StringRef,_true>.
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX =
               &objects.super_SmallVectorStorage<llvm::StringRef,_32U>;
          objects.super_SmallVectorImpl<llvm::StringRef>.
          super_SmallVectorTemplateBase<llvm::StringRef,_true>.
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
          objects.super_SmallVectorImpl<llvm::StringRef>.
          super_SmallVectorTemplateBase<llvm::StringRef,_true>.
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity =
               0x20;
          local_288.cString = value_local.Data;
          sStack_280 = value_local.Length;
          Separator_00.Length = 1;
          Separator_00.Data = " ";
          llvm::StringRef::split
                    ((StringRef *)&local_288,&objects.super_SmallVectorImpl<llvm::StringRef>,
                     Separator_00,-1,false);
          local_288.twine = (Twine *)0x0;
          sStack_280 = 0;
          local_278 = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_initialize<llvm::StringRef*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_288
                     ,objects.super_SmallVectorImpl<llvm::StringRef>.
                      super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                      BeginX,(void *)((objects.super_SmallVectorImpl<llvm::StringRef>.
                                       super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                       super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                       super_SmallVectorBase._8_8_ & 0xffffffff) * 0x10 +
                                     (long)objects.super_SmallVectorImpl<llvm::StringRef>.
                                           super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                           super_SmallVectorBase.BeginX));
          pvVar5 = &this->otherArgs;
          goto LAB_0017e11b;
        }
        break;
      }
      llvm::StringRef::str_abi_cxx11_((string *)&objects,&value_local);
      this_00 = (string *)&this->tempsPath;
    }
LAB_0017e19d:
    std::__cxx11::string::operator=(this_00,(string *)&objects);
    std::__cxx11::string::_M_dispose();
    return true;
  case 0xb:
    iVar3 = bcmp(to,"module-name",0xb);
    if (iVar3 == 0) {
      llvm::StringRef::str_abi_cxx11_((string *)&objects,&value_local);
      this_00 = (string *)&this->moduleName;
      goto LAB_0017e19d;
    }
    iVar3 = bcmp(to,"num-threads",0xb);
    if (iVar3 == 0) {
      numThreadsInt = 0;
      tVar1 = llvm::StringRef::getAsInteger<int>(&value_local,10,&numThreadsInt);
      if (tVar1) {
        llvm::Twine::Twine((Twine *)&local_288,"\'",&name_local);
        pcVar6 = "\' should be an int.";
      }
      else {
        if (-1 < numThreadsInt) {
          llvm::StringRef::str_abi_cxx11_((string *)&objects,&value_local);
          this_00 = (string *)&this->numThreads;
          goto LAB_0017e19d;
        }
        llvm::Twine::Twine((Twine *)&local_288,"\'",&name_local);
        pcVar6 = "\' should be greater than or equal to zero.";
      }
      llvm::Twine::Twine(&local_258,pcVar6);
      llvm::Twine::concat((Twine *)&objects,(Twine *)&local_288,&local_258);
      llbuild::buildsystem::ConfigureContext::error(ctx,(Twine *)&objects);
      return false;
    }
    break;
  case 0xc:
    iVar3 = bcmp(to,"import-paths",0xc);
    if (iVar3 != 0) break;
    objects.super_SmallVectorImpl<llvm::StringRef>.
    super_SmallVectorTemplateBase<llvm::StringRef,_true>.
    super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX =
         &objects.super_SmallVectorStorage<llvm::StringRef,_32U>;
    objects.super_SmallVectorImpl<llvm::StringRef>.
    super_SmallVectorTemplateBase<llvm::StringRef,_true>.
    super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
    objects.super_SmallVectorImpl<llvm::StringRef>.
    super_SmallVectorTemplateBase<llvm::StringRef,_true>.
    super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity = 0x20;
    local_288.cString = value_local.Data;
    sStack_280 = value_local.Length;
    Separator_02.Length = 1;
    Separator_02.Data = " ";
    llvm::StringRef::split
              ((StringRef *)&local_288,&objects.super_SmallVectorImpl<llvm::StringRef>,Separator_02,
               -1,false);
    local_288.twine = (Twine *)0x0;
    sStack_280 = 0;
    local_278 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<llvm::StringRef*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_288,
               objects.super_SmallVectorImpl<llvm::StringRef>.
               super_SmallVectorTemplateBase<llvm::StringRef,_true>.
               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX,
               (void *)((objects.super_SmallVectorImpl<llvm::StringRef>.
                         super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                         super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                         super_SmallVectorBase._8_8_ & 0xffffffff) * 0x10 +
                       (long)objects.super_SmallVectorImpl<llvm::StringRef>.
                             super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                             super_SmallVectorBase.BeginX));
    pvVar5 = &this->importPaths;
LAB_0017e11b:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(pvVar5,&local_288);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_288);
    llvm::SmallVectorImpl<llvm::StringRef>::~SmallVectorImpl
              (&objects.super_SmallVectorImpl<llvm::StringRef>);
    return true;
  case 0x12:
    iVar3 = bcmp(to,"module-output-path",0x12);
    if (iVar3 == 0) {
      llvm::StringRef::str_abi_cxx11_((string *)&objects,&value_local);
      this_00 = (string *)&this->moduleOutputPath;
      goto LAB_0017e19d;
    }
    break;
  default:
    if ((name_local.Length == 0x20) &&
       (iVar3 = bcmp(to,"enable-whole-module-optimization",0x20), iVar3 == 0)) {
      ctx_00 = (ConfigureContext *)&this->enableWholeModuleOptimization;
      pcVar4 = (char *)0x20;
LAB_0017e16f:
      value_00.Length = value_local.Length;
      value_00.Data = value_local.Data;
      name_00.Length = (size_t)pcVar6;
      name_00.Data = pcVar4;
      bVar2 = configureBool((SwiftCompilerShellCommand *)ctx,ctx_00,to,name_00,value_00);
      if (bVar2) {
        return true;
      }
      return false;
    }
  }
  bVar2 = llbuild::buildsystem::ExternalCommand::configureAttribute
                    (&this->super_ExternalCommand,ctx,name,value);
  return bVar2;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext& ctx, StringRef name,
                                  StringRef value) override {
    if (name == "executable") {
      executable = value;
    } else if (name == "module-name") {
      moduleName = value;
    } else if (name == "module-output-path") {
      moduleOutputPath = value;
    } else if (name == "sources") {
      SmallVector<StringRef, 32> sources;
      StringRef(value).split(sources, " ", /*MaxSplit=*/-1,
                             /*KeepEmpty=*/false);
      sourcesList = std::vector<std::string>(sources.begin(), sources.end());
    } else if (name == "objects") {
      SmallVector<StringRef, 32> objects;
      StringRef(value).split(objects, " ", /*MaxSplit=*/-1,
                             /*KeepEmpty=*/false);
      objectsList = std::vector<std::string>(objects.begin(), objects.end());
    } else if (name == "import-paths") {
      SmallVector<StringRef, 32> imports;
      StringRef(value).split(imports, " ", /*MaxSplit=*/-1,
                             /*KeepEmpty=*/false);
      importPaths = std::vector<std::string>(imports.begin(), imports.end());
    } else if (name == "temps-path") {
      tempsPath = value;
    } else if (name == "is-library") {
      if (!configureBool(ctx, isLibrary, name, value))
        return false;
    } else if (name == "enable-whole-module-optimization") {
      if (!configureBool(ctx, enableWholeModuleOptimization, name, value))
        return false;
    } else if (name == "num-threads") {
      int numThreadsInt = 0;
      if (value.getAsInteger(10, numThreadsInt)) {
        ctx.error("'" + name + "' should be an int.");
        return false;
      }
      if (numThreadsInt < 0) {
        ctx.error("'" + name + "' should be greater than or equal to zero.");
        return false;
      }
      numThreads = value;
    } else if (name == "other-args") {
      SmallVector<StringRef, 32> args;
      StringRef(value).split(args, " ", /*MaxSplit=*/-1,
                             /*KeepEmpty=*/false);
      otherArgs = std::vector<std::string>(args.begin(), args.end());
    } else {
      return ExternalCommand::configureAttribute(ctx, name, value);
    }

    return true;
  }